

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void check_vectors<char>(vector<char,_std::allocator<char>_> *lhs,
                        vector<char,_std::allocator<char>_> *rhs)

{
  equal_coll_impl local_89;
  assertion_result local_88;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  char *local_28;
  
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/test_common.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_88,&local_89,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (lhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (rhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                      (rhs->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_002eb6f8;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_28 = "";
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/test_common.h"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,&local_40,&local_70,0x11,1,0xd,4,"lhs.begin()","lhs.end()","rhs.begin()",
             "rhs.end()");
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  return;
}

Assistant:

void check_vectors(const std::vector<T>& lhs, const std::vector<T>& rhs) {
  BOOST_CHECK_EQUAL_COLLECTIONS(lhs.begin(), lhs.end(), rhs.begin(), rhs.end());
}